

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::ListOp<tinyusdz::Payload>::ClearAndMakeExplicit(ListOp<tinyusdz::Payload> *this)

{
  Payload *pPVar1;
  Payload *pPVar2;
  
  pPVar1 = (this->explicit_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->explicit_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar1,pPVar2);
    (this->explicit_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->added_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->added_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar1,pPVar2);
    (this->added_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->prepended_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->prepended_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar1,pPVar2);
    (this->prepended_items).
    super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->appended_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->appended_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar1,pPVar2);
    (this->appended_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->deleted_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->deleted_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar1,pPVar2);
    (this->deleted_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->ordered_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->ordered_items).
           super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar1,pPVar2);
    (this->ordered_items).super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }